

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<14,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_4,_2> *mat;
  VecAccess<float,_4,_3> local_a0;
  Matrix<float,_4,_2> local_88;
  Vector<float,_3> local_68 [2];
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  undefined1 local_38 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[2] = (float)in1Type;
  in0.m_data.m_data[1].m_data[3] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,7>((Mat2x4 *)local_38,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
  }
  else {
    getInputValue<0,7>((Mat2x4 *)local_38,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
  }
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_50,(Mat2x4 *)local_38);
  decrement<float,4,2>(&local_88,(MatrixCaseUtils *)local_38,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_68,&local_88);
  tcu::operator+((tcu *)&local_44,&local_50,local_68);
  tcu::Vector<float,_4>::xyz(&local_a0,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_a0,&local_44);
  tcu::Matrix<float,_4,_2>::~Matrix(&local_88);
  tcu::Matrix<float,_4,_2>::~Matrix((Matrix<float,_4,_2> *)local_38);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}